

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O3

string_t duckdb::StringFromTimestamp<true>(timestamp_t input,Vector *vector)

{
  int iVar1;
  int32_t val;
  undefined **ppuVar2;
  long lVar3;
  idx_t length;
  unsigned_long uVar4;
  ulong uVar5;
  long lVar6;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t len;
  size_t __n;
  char *data;
  anon_union_16_2_67f50693_for_value aVar7;
  char nano_buffer [6];
  char micro_buffer [6];
  int32_t date [3];
  int32_t time [4];
  int32_t picos;
  date_t date_entry;
  dtime_t time_entry;
  char local_94 [8];
  char local_8c [8];
  int local_84;
  int32_t local_80;
  int32_t local_7c;
  int32_t local_78;
  int32_t local_74;
  int32_t local_70;
  int32_t local_6c [4];
  int32_t local_5c;
  undefined1 local_58 [16];
  idx_t local_48;
  date_t local_3c;
  dtime_t local_38;
  
  if (input.value == -0x7fffffffffffffff) {
    ppuVar2 = &Date::NINF;
  }
  else {
    if (input.value != 0x7fffffffffffffff) {
      local_5c = 0;
      Timestamp::Convert((timestamp_ns_t)input.value,&local_3c,&local_38,&local_5c);
      local_5c = local_5c * 1000;
      Date::Convert(local_3c,&local_84,&local_80,&local_7c);
      Time::Convert(local_38,&local_78,&local_74,&local_70,local_6c);
      iVar1 = local_84;
      local_8c[4] = '\0';
      local_8c[5] = '\0';
      local_8c[0] = '\0';
      local_8c[1] = '\0';
      local_8c[2] = '\0';
      local_8c[3] = '\0';
      local_94[4] = '\0';
      local_94[5] = '\0';
      local_94[0] = '\0';
      local_94[1] = '\0';
      local_94[2] = '\0';
      local_94[3] = '\0';
      lVar3 = 6;
      if (local_84 < 1) {
        local_84 = 1 - local_84;
        lVar3 = 0xb;
      }
      lVar6 = (ulong)(999999 < local_84) + (ulong)(99999 < local_84) + (ulong)(9999 < local_84);
      local_48 = (ulong)(9999999 < local_84) + 4 + lVar6;
      lVar3 = lVar3 + lVar6 + (ulong)(9999999 < local_84);
      lVar6 = lVar3 + 4;
      length = TimeToStringCast::MicrosLength(local_6c[0],local_8c);
      if (local_5c == 0) {
        __n = 0;
        len = extraout_RDX;
      }
      else {
        val = TimeToStringCast::FormatMicros(local_5c,local_94);
        uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
        __n = 6 - uVar4;
        length = 0xf;
        len = extraout_RDX_00;
      }
      local_58 = (undefined1  [16])
                 StringVector::EmptyString
                           ((StringVector *)vector,(Vector *)(lVar6 + __n + length + 1),len);
      data = local_58._8_8_;
      if (local_58._0_4_ < 0xd) {
        data = local_58 + 4;
      }
      DateToStringCast::Format(data,local_84,local_80,local_7c,local_48,iVar1 < 1);
      data[lVar6] = ' ';
      TimeToStringCast::Format
                (data + lVar6 + 1,length,local_78,local_74,local_70,local_6c[0],local_8c);
      switchD_00b03519::default(data + length + lVar3 + 5,local_94,__n);
      uVar5 = (ulong)(uint)local_58._0_4_;
      if (uVar5 < 0xd) {
        switchD_005681f0::default(local_58 + 4 + uVar5,0,0xc - uVar5);
      }
      else {
        local_58._4_4_ = *(undefined4 *)local_58._8_8_;
      }
      aVar7.pointer.ptr = (char *)local_58._8_8_;
      aVar7._0_8_ = local_58._0_8_;
      return (string_t)aVar7;
    }
    ppuVar2 = (undefined **)&Date::PINF;
  }
  aVar7.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,*ppuVar2);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar7.pointer;
}

Assistant:

duckdb::string_t StringFromTimestamp(timestamp_t input, Vector &vector) {
	if (input == timestamp_t::infinity()) {
		return StringVector::AddString(vector, Date::PINF);
	}
	if (input == timestamp_t::ninfinity()) {
		return StringVector::AddString(vector, Date::NINF);
	}

	date_t date_entry;
	dtime_t time_entry;
	int32_t picos = 0;
	if (HAS_NANOS) {
		timestamp_ns_t ns;
		ns.value = input.value;
		Timestamp::Convert(ns, date_entry, time_entry, picos);
		// Use picoseconds so we have 6 digits
		picos *= 1000;
	} else {
		Timestamp::Convert(input, date_entry, time_entry);
	}

	int32_t date[3], time[4];
	Date::Convert(date_entry, date[0], date[1], date[2]);
	Time::Convert(time_entry, time[0], time[1], time[2], time[3]);

	// format for timestamp is DATE TIME (separated by space)
	idx_t year_length;
	bool add_bc;
	char micro_buffer[6] = {};
	char nano_buffer[6] = {};
	idx_t date_length = DateToStringCast::Length(date, year_length, add_bc);
	idx_t time_length = TimeToStringCast::Length(time, micro_buffer);
	idx_t nano_length = 0;
	if (picos) {
		//	If there are ps, we need all the µs
		time_length = 15;
		nano_length = 6;
		nano_length -= NumericCast<idx_t>(TimeToStringCast::FormatMicros(picos, nano_buffer));
	}
	const idx_t length = date_length + 1 + time_length + nano_length;

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	DateToStringCast::Format(data, date, year_length, add_bc);
	data += date_length;
	*data++ = ' ';
	TimeToStringCast::Format(data, time_length, time, micro_buffer);
	data += time_length;
	memcpy(data, nano_buffer, nano_length);
	D_ASSERT(data + nano_length <= result.GetDataWriteable() + length);

	result.Finalize();
	return result;
}